

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

size_t __thiscall
axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::find
          (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this,C c,size_t index)

{
  size_t sVar1;
  C *in_RDX;
  long in_RDI;
  size_t result;
  C *local_38;
  C c_00;
  size_t in_stack_ffffffffffffffd8;
  C *local_8;
  
  if (in_RDX < *(C **)(in_RDI + 0x10)) {
    c_00 = (C)((ulong)in_RDI >> 0x38);
    if (in_RDX == (C *)0x0) {
      local_8 = (C *)StringDetailsBase<char>::find((C *)0x0,in_stack_ffffffffffffffd8,c_00);
    }
    else {
      sVar1 = StringDetailsBase<char>::find(in_RDX,in_stack_ffffffffffffffd8,c_00);
      if (sVar1 == 0xffffffffffffffff) {
        local_38 = (C *)0xffffffffffffffff;
      }
      else {
        local_38 = in_RDX + sVar1;
      }
      local_8 = local_38;
    }
  }
  else {
    local_8 = (C *)0xffffffffffffffff;
  }
  return (size_t)local_8;
}

Assistant:

size_t
	find(
		C c,
		size_t index = 0
	) const {
		if (index >= m_length)
			return -1;

		if (index == 0)
			return Details::find(m_p, m_length, c);

		size_t result = Details::find(m_p + index, m_length - index, c);
		return result != -1 ? result + index : -1;
	}